

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O0

int __thiscall cmCPackExternalGenerator::InitializeInternal(cmCPackExternalGenerator *this)

{
  cmCPackLog *this_00;
  bool bVar1;
  ostream *this_01;
  char *msg;
  string *psVar2;
  unique_ptr<cmCPackExternalGenerator::cmCPackExternalVersion1Generator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersion1Generator>_>
  local_240;
  allocator<char> local_231;
  string local_230;
  cmValue local_210;
  undefined1 local_208 [8];
  string major;
  ostringstream local_1c8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_39;
  string local_38;
  cmCPackExternalGenerator *local_18;
  cmCPackExternalGenerator *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CPACK_EXTERNAL_KNOWN_VERSIONS",&local_39);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_38,"1.0");
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackExternal.cmake");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"CPACK_EXTERNAL_SELECTED_MAJOR",&local_231);
    local_210 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_230);
    psVar2 = cmValue::operator_cast_to_string_(&local_210);
    std::__cxx11::string::string((string *)local_208,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_208,"1");
    if (bVar1) {
      std::
      make_unique<cmCPackExternalGenerator::cmCPackExternalVersion1Generator,cmCPackExternalGenerator*>
                ((cmCPackExternalGenerator **)&local_240);
      std::
      unique_ptr<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>>
      ::operator=((unique_ptr<cmCPackExternalGenerator::cmCPackExternalVersionGenerator,std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersionGenerator>>
                   *)&this->Generator,&local_240);
      std::
      unique_ptr<cmCPackExternalGenerator::cmCPackExternalVersion1Generator,_std::default_delete<cmCPackExternalGenerator::cmCPackExternalVersion1Generator>_>
      ::~unique_ptr(&local_240);
    }
    this_local._4_4_ = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
    std::__cxx11::string::~string((string *)local_208);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    this_01 = std::operator<<((ostream *)local_1c8,"Error while executing CPackExternal.cmake");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackExternalGenerator.cxx"
                    ,0x1d,msg);
    std::__cxx11::string::~string((string *)(major.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackExternalGenerator::InitializeInternal()
{
  this->SetOption("CPACK_EXTERNAL_KNOWN_VERSIONS", "1.0");

  if (!this->ReadListFile("Internal/CPack/CPackExternal.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while executing CPackExternal.cmake" << std::endl);
    return 0;
  }

  std::string major = this->GetOption("CPACK_EXTERNAL_SELECTED_MAJOR");
  if (major == "1") {
    this->Generator = cm::make_unique<cmCPackExternalVersion1Generator>(this);
  }

  return this->Superclass::InitializeInternal();
}